

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
spdlog::logger::log_<unsigned_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args)

{
  __int_type_conflict _Var1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  format_args args_00;
  log_msg log_msg;
  memory_buf_t buf;
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    buf.super_buffer<char>.ptr_ = buf.store_;
    buf.super_buffer<char>.size_ = 0;
    buf.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_004a82e0;
    buf.super_buffer<char>.capacity_ = 0xfa;
    log_msg.logger_name.data_ = (char *)*args;
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&log_msg;
    args_00.desc_ = 4;
    ::fmt::v9::vformat_to<fmt::v9::appender,_0>((appender)&buf,fmt,args_00);
    sVar6 = buf.super_buffer<char>.size_;
    pcVar5 = buf.super_buffer<char>.ptr_;
    pcVar3 = (this->name_)._M_dataplus._M_p;
    sVar4 = (this->name_)._M_string_length;
    log_msg.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    log_msg.logger_name.data_ = pcVar3;
    log_msg.logger_name.size_ = sVar4;
    log_msg.level = lvl;
    log_msg.thread_id = details::os::thread_id();
    log_msg.color_range_start = 0;
    log_msg.color_range_end = 0;
    log_msg.source.filename = loc.filename;
    log_msg.source.line = loc.line;
    log_msg.source._12_4_ = loc._12_4_;
    log_msg.source.funcname = loc.funcname;
    log_msg.payload.data_ = pcVar5;
    log_msg.payload.size_ = sVar6;
    log_it_(this,&log_msg,iVar2 <= (int)lvl,(bool)(_Var1 & 1));
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(&buf);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }